

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcXsim.c
# Opt level: O2

void Abc_NtkCycleInitState(Abc_Ntk_t *pNtk,int nFrames,int fUseXval,int fVerbose)

{
  void *pvVar1;
  void **ppvVar2;
  int iVar3;
  int iVar4;
  int Value1;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar7;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar8;
  int iVar9;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    Gia_ManRandom(1);
    pAVar5 = Abc_AigConst1(pNtk);
    pAVar5->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x2;
    for (iVar9 = 0; pVVar6 = pNtk->vBoxes, iVar9 < pVVar6->nSize; iVar9 = iVar9 + 1) {
      pAVar5 = Abc_NtkBox(pNtk,iVar9);
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
        pvVar1 = pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray];
        iVar3 = Abc_LatchInit(pAVar5);
        *(long *)((long)pvVar1 + 0x40) = (long)iVar3;
      }
    }
    iVar9 = 0;
    if (nFrames < 1) {
      nFrames = 0;
    }
    for (; iVar9 != nFrames; iVar9 = iVar9 + 1) {
      for (iVar3 = 0; iVar3 < pNtk->vPis->nSize; iVar3 = iVar3 + 1) {
        pAVar5 = Abc_NtkPi(pNtk,iVar3);
        aVar7 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x3;
        if (fUseXval == 0) {
          aVar7._0_4_ = Abc_XsimRand2();
          aVar7._4_4_ = 0;
        }
        pAVar5->field_6 = aVar7;
      }
      for (iVar3 = 0; iVar3 < pNtk->vObjs->nSize; iVar3 = iVar3 + 1) {
        pAVar5 = Abc_NtkObj(pNtk,iVar3);
        if (pAVar5 != (Abc_Obj_t *)0x0) {
          iVar4 = Abc_AigNodeIsAnd(pAVar5);
          if (iVar4 != 0) {
            iVar4 = Abc_ObjGetXsimFanin0(pAVar5);
            Value1 = Abc_ObjGetXsimFanin1(pAVar5);
            aVar8._0_4_ = Abc_XsimAnd(iVar4,Value1);
            aVar8._4_4_ = 0;
            pAVar5->field_6 = aVar8;
          }
        }
      }
      for (iVar3 = 0; iVar3 < pNtk->vCos->nSize; iVar3 = iVar3 + 1) {
        pAVar5 = Abc_NtkCo(pNtk,iVar3);
        iVar4 = Abc_ObjGetXsimFanin0(pAVar5);
        pAVar5->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)iVar4;
      }
      for (iVar3 = 0; pVVar6 = pNtk->vBoxes, iVar3 < pVVar6->nSize; iVar3 = iVar3 + 1) {
        pAVar5 = Abc_NtkBox(pNtk,iVar3);
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
          ppvVar2 = pAVar5->pNtk->vObjs->pArray;
          *(long *)((long)ppvVar2[*(pAVar5->vFanouts).pArray] + 0x40) =
               (long)*(int *)((long)ppvVar2[*(pAVar5->vFanins).pArray] + 0x40);
        }
      }
    }
    for (iVar9 = 0; iVar9 < pVVar6->nSize; iVar9 = iVar9 + 1) {
      pAVar5 = Abc_NtkBox(pNtk,iVar9);
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
        pAVar5->field_5 =
             (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)
             (long)*(int *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray] + 0x40);
      }
      pVVar6 = pNtk->vBoxes;
    }
    return;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcXsim.c"
                ,0xc4,"void Abc_NtkCycleInitState(Abc_Ntk_t *, int, int, int)");
}

Assistant:

void Abc_NtkCycleInitState( Abc_Ntk_t * pNtk, int nFrames, int fUseXval, int fVerbose )
{ 
    Abc_Obj_t * pObj;
    int i, f;
    assert( Abc_NtkIsStrash(pNtk) );
//    srand( 0x12341234 );
    Gia_ManRandom( 1 );
    // initialize the values
    Abc_ObjSetXsim( Abc_AigConst1(pNtk), XVS1 );
    Abc_NtkForEachLatch( pNtk, pObj, i )
        Abc_ObjSetXsim( Abc_ObjFanout0(pObj), Abc_LatchInit(pObj) );
    // simulate for the given number of timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        Abc_NtkForEachPi( pNtk, pObj, i )
            Abc_ObjSetXsim( pObj, fUseXval? ABC_INIT_DC : Abc_XsimRand2() );
//            Abc_ObjSetXsim( pObj, ABC_INIT_ONE );
        Abc_AigForEachAnd( pNtk, pObj, i )
            Abc_ObjSetXsim( pObj, Abc_XsimAnd(Abc_ObjGetXsimFanin0(pObj), Abc_ObjGetXsimFanin1(pObj)) );
        Abc_NtkForEachCo( pNtk, pObj, i )
            Abc_ObjSetXsim( pObj, Abc_ObjGetXsimFanin0(pObj) );
        Abc_NtkForEachLatch( pNtk, pObj, i )
            Abc_ObjSetXsim( Abc_ObjFanout0(pObj), Abc_ObjGetXsim(Abc_ObjFanin0(pObj)) );
    }
    // set the final values
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        pObj->pData = (void *)(ABC_PTRINT_T)Abc_ObjGetXsim(Abc_ObjFanout0(pObj));
//        printf( "%d", Abc_LatchIsInit1(pObj) );
    }
//    printf( "\n" );
}